

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

atomic<void_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::id(SerialArenaChunk *this,uint32_t i)

{
  uint32_t t;
  char *pcVar1;
  LogMessage *pLVar2;
  CopyConst<char,_ElementType<1UL>_> *pCVar3;
  LayoutType<std::integer_sequence<unsigned_long,_1UL>,_sizeof___(Ts)___adl_barrier::Min(sizeof___(Ts),_integer_sequence<unsigned_long,_1UL>::size()),_google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>
  local_60;
  LogMessage local_40;
  Voidify local_29;
  uint local_28;
  uint local_24;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  SerialArenaChunk *pSStack_10;
  uint32_t i_local;
  SerialArenaChunk *this_local;
  
  absl_log_internal_check_op_result._4_4_ = i;
  pSStack_10 = this;
  local_24 = absl::lts_20250127::log_internal::GetReferenceableValue(i);
  t = capacity(this);
  local_28 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  local_20 = absl::lts_20250127::log_internal::Check_LTImpl<unsigned_int,unsigned_int>
                       (&local_24,&local_28,"i < capacity()");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x1c4,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  local_60.size_ = (size_t  [2])Layout(this);
  pcVar1 = ptr(this);
  pCVar3 = absl::lts_20250127::container_internal::internal_layout::
           LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long,1ul>,std::integer_sequence<unsigned_long,0ul,1ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
           ::Pointer<1ul,char>((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long,1ul>,std::integer_sequence<unsigned_long,0ul,1ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                                *)&local_60,pcVar1);
  return pCVar3 + absl_log_internal_check_op_result._4_4_;
}

Assistant:

std::atomic<void*>& id(uint32_t i) {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kIds>(ptr())[i];
  }